

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckedOffsetReader.h
# Opt level: O0

void __thiscall CheckedOffsetReader::setpos(CheckedOffsetReader *this,uint64_t off)

{
  undefined8 *puVar1;
  element_type *peVar2;
  uint64_t off_local;
  CheckedOffsetReader *this_local;
  
  if (this->_size < off) {
    printf("setpos(%llx) [%llx .. %llx]\n",off,this->_baseofs,this->_size);
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "setpos beyond limit";
    __cxa_throw(puVar1,&char_const*::typeinfo,0);
  }
  peVar2 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->_r);
  (*peVar2->_vptr_ReadWriter[4])(peVar2,off + this->_baseofs);
  this->_curpos = off;
  return;
}

Assistant:

virtual void setpos(uint64_t off)
    {
        if (off>_size) {
            printf("setpos(%llx) [%llx .. %llx]\n", off, _baseofs, _size);
            throw "setpos beyond limit";
        }
        _r->setpos(off+_baseofs);
        _curpos= off;
    }